

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableNoCopy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  bool bVar1;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  string *new_string;
  byte local_61;
  LogMessage local_60;
  Arena *local_28;
  Arena *arena_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  
  local_28 = arena;
  arena_local = (Arena *)default_value;
  default_value_local = (string *)this;
  bVar1 = IsDonatedString(this);
  if ((bVar1) || (bVar1 = IsDefault(this,(string *)arena_local), bVar1)) {
    bVar1 = IsDefault(this,(string *)arena_local);
    local_61 = 0;
    if (!bVar1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
                 ,0x8e);
      local_61 = 1;
      other = LogMessage::operator<<(&local_60,"CHECK failed: IsDefault(default_value): ");
      LogFinisher::operator=((LogFinisher *)((long)&new_string + 3),other);
    }
    if ((local_61 & 1) != 0) {
      LogMessage::~LogMessage(&local_60);
    }
    p = Arena::Create<std::__cxx11::string>(local_28);
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (&this->tagged_ptr_,p);
    this_local = (ArenaStringPtr *)p;
  }
  else {
    this_local = (ArenaStringPtr *)UnsafeMutablePointer_abi_cxx11_(this);
  }
  return (string *)this_local;
}

Assistant:

std::string* ArenaStringPtr::MutableNoCopy(const std::string* default_value,
                                           ::google::protobuf::Arena* arena) {
  if (!IsDonatedString() && !IsDefault(default_value)) {
    return UnsafeMutablePointer();
  } else {
    GOOGLE_DCHECK(IsDefault(default_value));
    // Allocate empty. The contents are not relevant.
    std::string* new_string = Arena::Create<std::string>(arena);
    tagged_ptr_.Set(new_string);
    return new_string;
  }
}